

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::PushMultiItemsWidths(int components,float w_full)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  float *pfVar3;
  int in_EDI;
  float in_XMM0_Da;
  float fVar4;
  int i;
  float w_item_last;
  float w_item_one;
  ImGuiStyle *style;
  ImGuiWindow *window;
  ImGuiContext *g;
  float *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar5;
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  fVar4 = ImMax<float>(1.0,(float)(int)((-(GImGui->Style).ItemInnerSpacing.x * (float)(in_EDI + -1)
                                        + in_XMM0_Da) / (float)in_EDI));
  ImMax<float>(1.0,(float)(int)(-(fVar4 + (pIVar2->Style).ItemInnerSpacing.x) * (float)(in_EDI + -1)
                               + in_XMM0_Da));
  ImVector<float>::push_back
            ((ImVector<float> *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             in_stack_ffffffffffffffc8);
  for (iVar5 = 0; iVar5 < in_EDI + -1; iVar5 = iVar5 + 1) {
    ImVector<float>::push_back
              ((ImVector<float> *)CONCAT44(iVar5,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffc8);
  }
  pfVar3 = ImVector<float>::back(&(pIVar1->DC).ItemWidthStack);
  (pIVar1->DC).ItemWidth = *pfVar3;
  (pIVar2->NextItemData).Flags = (pIVar2->NextItemData).Flags & 0xfffffffe;
  return;
}

Assistant:

void ImGui::PushMultiItemsWidths(int components, float w_full)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    const ImGuiStyle& style = g.Style;
    const float w_item_one  = ImMax(1.0f, IM_FLOOR((w_full - (style.ItemInnerSpacing.x) * (components - 1)) / (float)components));
    const float w_item_last = ImMax(1.0f, IM_FLOOR(w_full - (w_item_one + style.ItemInnerSpacing.x) * (components - 1)));
    window->DC.ItemWidthStack.push_back(w_item_last);
    for (int i = 0; i < components - 1; i++)
        window->DC.ItemWidthStack.push_back(w_item_one);
    window->DC.ItemWidth = window->DC.ItemWidthStack.back();
    g.NextItemData.Flags &= ~ImGuiNextItemDataFlags_HasWidth;
}